

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_init_alloc(uint32_t version,uint32_t locktime,size_t inputs_allocation_len,
                       size_t outputs_allocation_len,wally_tx **output)

{
  wally_tx *ptr;
  wally_tx_input *ptr_00;
  wally_tx_output *ptr_01;
  int iVar1;
  
  if (output == (wally_tx **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (wally_tx *)0x0;
    ptr = (wally_tx *)wally_calloc(0x38);
    *output = ptr;
    iVar1 = -3;
    if (ptr != (wally_tx *)0x0) {
      if (inputs_allocation_len == 0) {
        ptr_00 = (wally_tx_input *)0x0;
      }
      else {
        ptr_00 = (wally_tx_input *)wally_malloc(inputs_allocation_len * 0xd0);
      }
      if (outputs_allocation_len == 0) {
        ptr_01 = (wally_tx_output *)0x0;
      }
      else {
        ptr_01 = (wally_tx_output *)wally_malloc(outputs_allocation_len * 0x70);
      }
      if ((ptr_00 == (wally_tx_input *)0x0 && inputs_allocation_len != 0) ||
         (outputs_allocation_len != 0 && ptr_01 == (wally_tx_output *)0x0)) {
        wally_free(ptr_00);
        wally_free(ptr_01);
        wally_free(ptr);
        *output = (wally_tx *)0x0;
      }
      else {
        ptr->version = version;
        ptr->locktime = locktime;
        ptr->inputs = ptr_00;
        iVar1 = 0;
        ptr->num_inputs = 0;
        ptr->inputs_allocation_len = inputs_allocation_len;
        ptr->outputs = ptr_01;
        ptr->num_outputs = 0;
        ptr->outputs_allocation_len = outputs_allocation_len;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_tx_init_alloc(uint32_t version, uint32_t locktime,
                        size_t inputs_allocation_len,
                        size_t outputs_allocation_len,
                        struct wally_tx **output)
{
    struct wally_tx_input *new_inputs = NULL;
    struct wally_tx_output *new_outputs = NULL;
    struct wally_tx *result;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx);

    if (inputs_allocation_len)
        new_inputs = wally_malloc(inputs_allocation_len * sizeof(struct wally_tx_input));
    if (outputs_allocation_len)
        new_outputs = wally_malloc(outputs_allocation_len * sizeof(struct wally_tx_output));
    if ((inputs_allocation_len && !new_inputs) ||
        (outputs_allocation_len && !new_outputs)) {
        wally_free(new_inputs);
        wally_free(new_outputs);
        wally_free(result);
        *output = NULL;
        return WALLY_ENOMEM;
    }

    result->version = version;
    result->locktime = locktime;
    result->inputs = new_inputs;
    result->num_inputs = 0;
    result->inputs_allocation_len = inputs_allocation_len;
    result->outputs = new_outputs;
    result->num_outputs = 0;
    result->outputs_allocation_len = outputs_allocation_len;
    return WALLY_OK;
}